

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TIntermediate::addBuiltInFunctionCall
          (TIntermediate *this,TSourceLoc *loc,TOperator op,bool unary,TIntermNode *childNode,
          TType *returnType)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long *plVar3;
  TIntermTyped *pTVar4;
  TSourceLoc *loc_00;
  TIntermUnary *pTVar5;
  undefined7 in_register_00000009;
  TIntermediate *this_00;
  TIntermediate *child;
  
  if ((int)CONCAT71(in_register_00000009,unary) == 0) {
    pTVar4 = setAggregateOperator(this,childNode,op,returnType,loc);
    return pTVar4;
  }
  iVar1 = (*childNode->_vptr_TIntermNode[3])(childNode);
  child = (TIntermediate *)CONCAT44(extraout_var,iVar1);
  if (child == (TIntermediate *)0x0) {
    pTVar5 = (TIntermUnary *)0x0;
  }
  else {
    lVar2 = (**(code **)(*(long *)child + 0x28))(child);
    if (lVar2 != 0) {
      plVar3 = (long *)(**(code **)(*(long *)child + 0x28))(child);
      pTVar4 = (TIntermTyped *)(**(code **)(*plVar3 + 0x188))(plVar3,op,returnType);
      if (pTVar4 != (TIntermTyped *)0x0) {
        return pTVar4;
      }
    }
    this_00 = child;
    loc_00 = (TSourceLoc *)(*(code *)**(undefined8 **)child)();
    pTVar5 = addUnaryNode(this_00,op,(TIntermTyped *)child,loc_00);
    (*(pTVar5->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar5,returnType);
  }
  return (TIntermTyped *)pTVar5;
}

Assistant:

TIntermTyped* TIntermediate::addBuiltInFunctionCall(const TSourceLoc& loc, TOperator op, bool unary,
    TIntermNode* childNode, const TType& returnType)
{
    if (unary) {
        //
        // Treat it like a unary operator.
        // addUnaryMath() should get the type correct on its own;
        // including constness (which would differ from the prototype).
        //
        TIntermTyped* child = childNode->getAsTyped();
        if (child == nullptr)
            return nullptr;

        if (child->getAsConstantUnion()) {
            TIntermTyped* folded = child->getAsConstantUnion()->fold(op, returnType);
            if (folded)
                return folded;
        }

        return addUnaryNode(op, child, child->getLoc(), returnType);
    } else {
        // setAggregateOperater() calls fold() for constant folding
        TIntermTyped* node = setAggregateOperator(childNode, op, returnType, loc);

        return node;
    }
}